

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManAddClauses(Gla_Man_t *p,int iObj,int iFrame,Vec_Int_t *vLits)

{
  int **ppiVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  sat_solver2 *s;
  Gla_Obj_t *pGVar6;
  long lVar7;
  long lVar8;
  int local_40;
  uint local_3c;
  long local_38;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                  ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
  }
  if (iObj == 0) {
    pGVar6 = (Gla_Obj_t *)0x0;
  }
  else {
    pGVar6 = p->pObjs + (uint)iObj;
  }
  uVar3 = *(uint *)&pGVar6->field_0x4;
  if ((uVar3 & 4) == 0) {
    if ((uVar3 & 0x20) == 0) {
      if (-1 < (char)uVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                      ,0x54f,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
      }
      local_38 = (long)p->pCnf->pObj2Count[pGVar6->iGiaObj];
      if (local_38 < 1) {
        return;
      }
      lVar7 = (long)p->pCnf->pObj2Clause[pGVar6->iGiaObj];
      local_38 = local_38 + lVar7;
      do {
        vLits->nSize = 0;
        ppiVar1 = p->pCnf->pClauses;
        puVar5 = (uint *)ppiVar1[lVar7];
        lVar8 = lVar7 + 1;
        if (puVar5 < ppiVar1[lVar7 + 1]) {
          do {
            iVar2 = Gla_ManGetVar(p,(int)*puVar5 >> 1,iFrame);
            Vec_IntPush(vLits,(*puVar5 & 1) + iVar2 * 2);
            puVar5 = puVar5 + 1;
          } while (puVar5 < p->pCnf->pClauses[lVar8]);
          lVar7 = (long)vLits->nSize;
        }
        else {
          lVar7 = 0;
        }
        sat_solver2_addclause(p->pSat,vLits->pArray,vLits->pArray + lVar7,iObj);
        lVar7 = lVar8;
      } while (lVar8 < local_38);
      return;
    }
    if ((uVar3 & 0xfffffe00) != 0x200) {
      __assert_fail("pGlaObj->nFanins == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGlaOld.c"
                    ,0x532,"void Gla_ManAddClauses(Gla_Man_t *, int, int, Vec_Int_t *)");
    }
    if (iFrame != 0) {
      uVar3 = Gla_ManGetVar(p,iObj,iFrame);
      uVar4 = Gla_ManGetVar(p,pGVar6->Fanins[0],iFrame + -1);
      if ((int)(uVar4 | uVar3) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.h"
                      ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
      }
      s = p->pSat;
      local_40 = uVar3 * 2;
      puVar5 = (uint *)&local_38;
      uVar4 = (*(uint *)&pGVar6->field_0x4 >> 1 & 1) + uVar4 * 2;
      local_3c = uVar4 ^ 1;
      sat_solver2_addclause(s,&local_40,(lit *)puVar5,iObj);
      local_3c = uVar4;
      goto LAB_0061245d;
    }
    iFrame = 0;
  }
  uVar3 = Gla_ManGetVar(p,iObj,iFrame);
  if ((int)uVar3 < 0) {
    __assert_fail("iVar >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.h"
                  ,0x10b,"int sat_solver2_add_const(sat_solver2 *, int, int, int, int)");
  }
  s = p->pSat;
  puVar5 = &local_3c;
LAB_0061245d:
  local_40 = uVar3 * 2 + 1;
  sat_solver2_addclause(s,&local_40,(lit *)puVar5,iObj);
  return;
}

Assistant:

void Gla_ManAddClauses( Gla_Man_t * p, int iObj, int iFrame, Vec_Int_t * vLits )
{
    Gla_Obj_t * pGlaObj = Gla_ManObj( p, iObj );
    int iVar, iVar1, iVar2;
    if ( pGlaObj->fConst )
    {
        iVar = Gla_ManGetVar( p, iObj, iFrame );
        sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
    }
    else if ( pGlaObj->fRo )
    {
        assert( pGlaObj->nFanins == 1 );
        if ( iFrame == 0 )
        {
            iVar = Gla_ManGetVar( p, iObj, iFrame );
            sat_solver2_add_const( p->pSat, iVar, 1, 0, iObj );
        }
        else
        {
            iVar1 = Gla_ManGetVar( p, iObj, iFrame );
            iVar2 = Gla_ManGetVar( p, pGlaObj->Fanins[0], iFrame-1 );
            sat_solver2_add_buffer( p->pSat, iVar1, iVar2, pGlaObj->fCompl0, 0, iObj );
        }
    }
    else if ( pGlaObj->fAnd )
    {
        int i, RetValue, nClauses, iFirstClause, * pLit;
        nClauses = p->pCnf->pObj2Count[pGlaObj->iGiaObj];
        iFirstClause = p->pCnf->pObj2Clause[pGlaObj->iGiaObj];
        for ( i = iFirstClause; i < iFirstClause + nClauses; i++ )
        {
            Vec_IntClear( vLits );
            for ( pLit = p->pCnf->pClauses[i]; pLit < p->pCnf->pClauses[i+1]; pLit++ )
            {
                iVar = Gla_ManGetVar( p, lit_var(*pLit), iFrame );
                Vec_IntPush( vLits, toLitCond( iVar, lit_sign(*pLit) ) );
            }
            RetValue = sat_solver2_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits), iObj );
        }
    }
    else assert( 0 );
}